

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.hpp
# Opt level: O1

shared_ptr<libtorrent::torrent_plugin> __thiscall
libtorrent::aux::session_impl::session_plugin_wrapper::new_torrent
          (session_plugin_wrapper *this,torrent_handle *t,client_data_t user)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<libtorrent::torrent_plugin> sVar1;
  void *local_18 [2];
  
  local_18[0] = user.m_client_ptr;
  if (t[1].m_torrent.super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    (*(code *)t[2].m_torrent.super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)(this,&(t->m_torrent).
                            super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount,user.m_type_ptr,local_18);
    sVar1.super___shared_ptr<libtorrent::torrent_plugin,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = extraout_RDX._M_pi;
    sVar1.super___shared_ptr<libtorrent::torrent_plugin,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (shared_ptr<libtorrent::torrent_plugin>)
           sVar1.super___shared_ptr<libtorrent::torrent_plugin,_(__gnu_cxx::_Lock_policy)2>;
  }
  ::std::__throw_bad_function_call();
}

Assistant:

std::shared_ptr<torrent_plugin> new_torrent(torrent_handle const& t, client_data_t const user) override
				{ return m_f(t, user); }